

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

coda_conversion *
coda_conversion_new(double numerator,double denominator,double add_offset,double invalid_value)

{
  coda_conversion *pcVar1;
  
  if ((denominator != 0.0) || (NAN(denominator))) {
    pcVar1 = (coda_conversion *)malloc(0x28);
    if (pcVar1 == (coda_conversion *)0x0) {
      pcVar1 = (coda_conversion *)0x0;
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x9c);
    }
    else {
      pcVar1->numerator = numerator;
      pcVar1->denominator = denominator;
      pcVar1->add_offset = add_offset;
      pcVar1->invalid_value = invalid_value;
      pcVar1->unit = (char *)0x0;
    }
  }
  else {
    pcVar1 = (coda_conversion *)0x0;
    coda_set_error(-400,"denominator may not be 0 for conversion");
  }
  return pcVar1;
}

Assistant:

coda_conversion *coda_conversion_new(double numerator, double denominator, double add_offset, double invalid_value)
{
    coda_conversion *conversion;

    if (denominator == 0.0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "denominator may not be 0 for conversion");
        return NULL;
    }
    conversion = (coda_conversion *)malloc(sizeof(coda_conversion));
    if (conversion == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_conversion), __FILE__, __LINE__);
        return NULL;
    }
    conversion->numerator = numerator;
    conversion->denominator = denominator;
    conversion->add_offset = add_offset;
    conversion->invalid_value = invalid_value;
    conversion->unit = NULL;

    return conversion;
}